

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O2

void sylvan_init_zdd(void)

{
  Task local_40;
  
  sylvan_init_mt();
  if (zdd_initialized == '\0') {
    zdd_initialized = '\x01';
    sylvan_register_quit(zdd_quit);
    sylvan_gc_add_mark(zdd_gc_mark_protected_CALL);
    sylvan_gc_add_mark(zdd_refs_mark_CALL);
    if (zdd_protected_created == '\0') {
      protect_create(&zdd_protected,0x1000);
      zdd_protected_created = '\x01';
    }
    local_40.f = zdd_refs_init_WRAP;
    local_40.thief = (_Worker *)0x1;
    lace_run_task(&local_40);
  }
  return;
}

Assistant:

void
sylvan_init_zdd()
{
    sylvan_init_mt();

    if (zdd_initialized) return;
    zdd_initialized = 1;

    sylvan_register_quit(zdd_quit);
    sylvan_gc_add_mark(TASK(zdd_gc_mark_protected));
    sylvan_gc_add_mark(TASK(zdd_refs_mark));

    if (!zdd_protected_created) {
        protect_create(&zdd_protected, 4096);
        zdd_protected_created = 1;
    }

    RUN(zdd_refs_init);
}